

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O1

void printPostIdxImm8s4Operand(MCInst *MI,uint OpNum,SStream *O)

{
  char *pcVar1;
  MCOperand *op;
  int64_t iVar2;
  char *pcVar3;
  undefined4 in_register_00000034;
  
  op = MCInst_getOperand(MI,3);
  iVar2 = MCOperand_getImm(op);
  pcVar3 = anon_var_dwarf_eddd2 + 0x11;
  if (((uint)iVar2 >> 8 & 1) == 0) {
    pcVar3 = "-";
  }
  pcVar1 = ", #%s%u";
  if (9 < ((uint)iVar2 & 0xff) << 2) {
    pcVar1 = ", #%s0x%x";
  }
  SStream_concat((SStream *)CONCAT44(in_register_00000034,OpNum),pcVar1 + 2,pcVar3);
  return;
}

Assistant:

static void printPostIdxImm8s4Operand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *MO = MCInst_getOperand(MI, OpNum);
	unsigned Imm = (unsigned int)MCOperand_getImm(MO);
	if (((Imm & 0xff) << 2) > HEX_THRESHOLD)
		SStream_concat(O, "#%s0x%x", ((Imm & 256) ? "" : "-"), ((Imm & 0xff) << 2));
	else
		SStream_concat(O, "#%s%u", ((Imm & 256) ? "" : "-"), ((Imm & 0xff) << 2));
}